

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

int latin1ToUTF8(uchar *out,int *outlen,uchar *in,int *inlen,void *vctxt)

{
  byte bVar1;
  undefined4 in_EAX;
  int iVar2;
  byte *pbVar3;
  long lVar4;
  int iVar5;
  undefined1 auVar6 [16];
  
  iVar5 = (int)out;
  auVar6._0_4_ = -(uint)(out == (uchar *)0x0);
  auVar6._4_4_ = -(uint)(in == (uchar *)0x0);
  auVar6._8_4_ = -(uint)(outlen == (int *)0x0);
  auVar6._12_4_ = -(uint)(inlen == (int *)0x0);
  iVar2 = movmskps(in_EAX,auVar6);
  if (iVar2 != 0) {
    return -1;
  }
  pbVar3 = out + *outlen;
  iVar2 = *inlen;
  lVar4 = 0;
  do {
    if (in + iVar2 <= in + lVar4) {
      iVar5 = (int)out - iVar5;
      iVar2 = iVar5;
LAB_0012d41e:
      *outlen = iVar5;
      *inlen = (int)lVar4;
      return iVar2;
    }
    bVar1 = in[lVar4];
    if ((char)bVar1 < '\0') {
      if ((long)pbVar3 - (long)out < 2) goto LAB_0012d416;
      *out = bVar1 >> 6 | 0xc0;
      out[1] = bVar1 & 0xbf;
      out = out + 2;
    }
    else {
      if (pbVar3 <= out) {
LAB_0012d416:
        iVar5 = (int)out - iVar5;
        iVar2 = -3;
        goto LAB_0012d41e;
      }
      *out = bVar1;
      out = out + 1;
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

static int
latin1ToUTF8(unsigned char* out, int *outlen,
             const unsigned char* in, int *inlen,
             void *vctxt ATTRIBUTE_UNUSED) {
    unsigned char* outstart = out;
    const unsigned char* instart = in;
    unsigned char* outend;
    const unsigned char* inend;
    int ret = XML_ENC_ERR_SPACE;

    if ((out == NULL) || (in == NULL) || (outlen == NULL) || (inlen == NULL))
	return(XML_ENC_ERR_INTERNAL);

    outend = out + *outlen;
    inend = in + *inlen;

    while (in < inend) {
        unsigned c = *in;

	if (c < 0x80) {
            if (out >= outend)
                goto done;
            *out++ = c;
	} else {
            if (outend - out < 2)
                goto done;
	    *out++ = (c >> 6) | 0xC0;
            *out++ = (c & 0x3F) | 0x80;
        }

        in++;
    }

    ret = out - outstart;

done:
    *outlen = out - outstart;
    *inlen = in - instart;
    return(ret);
}